

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

Gia_Man_t * Dau_ConstructAigFromFile(char *pFileName)

{
  int iLit0;
  FILE *__stream;
  Gia_Man_t *p_00;
  char *pcVar1;
  size_t sVar2;
  Gia_Man_t *p;
  FILE *pFile;
  int nLines;
  int i;
  char Buffer [1000];
  char *pFileName_local;
  
  pFile._0_4_ = 0;
  Buffer._992_8_ = pFileName;
  __stream = fopen(pFileName,"rb");
  p_00 = Gia_ManStart(1000);
  pcVar1 = Abc_UtilStrsav("func_enum_aig");
  p_00->pName = pcVar1;
  Gia_ManHashAlloc(p_00);
  for (pFile._4_4_ = 0; pFile._4_4_ < 5; pFile._4_4_ = pFile._4_4_ + 1) {
    Gia_ManAppendCi(p_00);
  }
  while (pcVar1 = fgets((char *)&nLines,1000,__stream), pcVar1 != (char *)0x0) {
    sVar2 = strlen((char *)&nLines);
    if (*(char *)((long)&pFile + sVar2 + 7) == '\n') {
      sVar2 = strlen((char *)&nLines);
      *(undefined1 *)((long)&pFile + sVar2 + 7) = 0;
    }
    sVar2 = strlen((char *)&nLines);
    if (*(char *)((long)&pFile + sVar2 + 7) == '\r') {
      sVar2 = strlen((char *)&nLines);
      *(undefined1 *)((long)&pFile + sVar2 + 7) = 0;
    }
    iLit0 = Dau_ParseFormulaAig(p_00,Buffer + 3);
    Gia_ManAppendCo(p_00,iLit0);
    pFile._0_4_ = (uint)pFile + 1;
  }
  printf("Finish constructing AIG for %d structures.\n",(ulong)(uint)pFile);
  return p_00;
}

Assistant:

Gia_Man_t * Dau_ConstructAigFromFile( char * pFileName )
{
    char Buffer[1000];
    int i, nLines = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    Gia_Man_t * p = Gia_ManStart( 1000 );
    p->pName = Abc_UtilStrsav( "func_enum_aig" );
    Gia_ManHashAlloc( p );
    for ( i = 0; i < 5; i++ )
        Gia_ManAppendCi( p );
    while ( fgets( Buffer, 1000, pFile ) )
    {
        if ( Buffer[strlen(Buffer)-1] == '\n' )
            Buffer[strlen(Buffer)-1] = 0;
        if ( Buffer[strlen(Buffer)-1] == '\r' )
            Buffer[strlen(Buffer)-1] = 0;
        Gia_ManAppendCo( p, Dau_ParseFormulaAig(p, Buffer + 11) );
        nLines++;
    }
    printf( "Finish constructing AIG for %d structures.\n", nLines );
    return p;
}